

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngframe.cpp
# Opt level: O3

void __thiscall
apngasm::APNGFrame::APNGFrame
          (APNGFrame *this,rgb *pixels,uint width,uint height,rgb *trns_color,uint delayNum,
          uint delayDen)

{
  uchar *__dest;
  uchar **ppuVar1;
  uint uVar2;
  ulong uVar3;
  
  this->_paletteSize = 0;
  this->_transparencySize = 0;
  this->_pixels = (uchar *)0x0;
  this->_width = 0;
  this->_height = 0;
  this->_colorType = '\0';
  this->_delayNum = delayNum;
  this->_delayDen = delayDen;
  this->_rows = (uchar **)0x0;
  memset(this->_palette,0,0x400);
  if (pixels != (rgb *)0x0) {
    this->_width = width;
    this->_height = height;
    this->_colorType = '\x02';
    uVar3 = (ulong)(width * height * 3);
    __dest = (uchar *)operator_new__(uVar3);
    this->_pixels = __dest;
    ppuVar1 = (uchar **)operator_new__((ulong)height << 6);
    this->_rows = ppuVar1;
    memcpy(__dest,pixels,uVar3);
    if (height != 0) {
      uVar2 = 0;
      uVar3 = 0;
      do {
        this->_rows[uVar3] = this->_pixels + uVar2;
        uVar3 = uVar3 + 1;
        uVar2 = uVar2 + width * 3;
      } while (height != uVar3);
    }
    if (trns_color != (rgb *)0x0) {
      this->_transparency[0] = '\0';
      this->_transparency[1] = trns_color->r;
      this->_transparency[2] = '\0';
      this->_transparency[3] = trns_color->g;
      this->_transparency[4] = '\0';
      this->_transparency[5] = trns_color->b;
      this->_transparencySize = 6;
    }
  }
  return;
}

Assistant:

APNGFrame::APNGFrame(rgb *pixels, unsigned int width, unsigned int height,
                     rgb *trns_color, unsigned delayNum, unsigned delayDen)
    : _pixels(NULL), _width(0), _height(0), _colorType(0), _paletteSize(0),
      _transparencySize(0), _delayNum(delayNum), _delayDen(delayDen),
      _rows(NULL) {
  memset(_palette, 0, sizeof(_palette));
  memset(_transparency, 0, sizeof(_transparency));

  if (pixels != NULL) {
    png_uint_32 rowbytes = width * 3;

    _width = width;
    _height = height;
    _colorType = 2;

    _pixels = new unsigned char[_height * rowbytes];
    _rows = new png_bytep[_height * sizeof(png_bytep)];

    memcpy(_pixels, pixels, _height * rowbytes);

    for (unsigned int i = 0; i < _height; ++i)
      _rows[i] = _pixels + i * rowbytes;

    if (trns_color != NULL) {
      _transparency[0] = 0;
      _transparency[1] = trns_color->r;
      _transparency[2] = 0;
      _transparency[3] = trns_color->g;
      _transparency[4] = 0;
      _transparency[5] = trns_color->b;
      _transparencySize = 6;
    }
  }
}